

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O2

CamSource *
camera_source_init(char *device,RK_U32 bufcnt,RK_U32 width,RK_U32 height,MppFrameFormat format)

{
  v4l2_buf_type vVar1;
  RK_S32 RVar2;
  CamSource *ctx;
  void *pvVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  MppBuffer *ppvVar8;
  v4l2_buf_type type;
  ulong local_288;
  v4l2_fmtdesc fmtdesc;
  v4l2_plane *pvStack_240;
  uint local_238;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  uint local_204;
  v4l2_buf_type local_1fc;
  __u32 local_1f8;
  undefined8 local_1f4;
  ulong uStack_1ec;
  undefined8 local_1e4;
  undefined8 uStack_1dc;
  undefined8 local_1d4;
  undefined8 uStack_1cc;
  undefined8 local_1c4;
  uint local_1bc;
  v4l2_buf_type local_1b8;
  undefined4 local_1b4;
  undefined8 local_1b0;
  v4l2_buf_type local_1a8;
  undefined1 local_1a4 [4];
  RK_U32 local_1a0;
  RK_U32 local_19c;
  RK_U32 local_198;
  v4l2_plane planes [1];
  v4l2_capability cap;
  
  ctx = (CamSource *)mpp_osal_calloc("camera_source_init",0x150);
  if (ctx != (CamSource *)0x0) {
    ctx->bufcnt = bufcnt;
    RVar2 = open(device,0x80002,0);
    ctx->fd = RVar2;
    if (RVar2 < 0) {
      pcVar4 = "Cannot open device\n";
    }
    else {
      local_1a8 = 0;
      local_288 = (ulong)format;
      while (RVar2 = camera_source_ioctl(RVar2,-0x3fafa9e6,&local_1a8), RVar2 == 0) {
        _mpp_log_l(4,"camera_source","input devices:%s\n",0,local_1a4);
        local_1a8 = local_1a8 + V4L2_BUF_TYPE_VIDEO_CAPTURE;
        RVar2 = ctx->fd;
      }
      RVar2 = camera_source_ioctl(ctx->fd,-0x7f97aa00,&cap);
      if (RVar2 == 0) {
        if ((cap.capabilities & 0x1001) == 0) {
          pcVar4 = "Capture not supported\n";
        }
        else if ((cap.capabilities >> 0x1a & 1) == 0) {
          pcVar4 = "Streaming IO Not Supported\n";
        }
        else {
          memset(&local_1a8,0,0xd0);
          fmtdesc.type = (cap.capabilities >> 9 & 8) + V4L2_BUF_TYPE_VIDEO_CAPTURE;
          fmtdesc.index = 0;
          local_1a8 = fmtdesc.type;
          local_1a0 = width;
          local_19c = height;
          while (RVar2 = camera_source_ioctl(ctx->fd,-0x3fbfa9fe,&fmtdesc), vVar1 = local_1a8,
                RVar2 == 0) {
            _mpp_log_l(4,"camera_source","fmt name: [%s]\n",0,fmtdesc.description);
            _mpp_log_l(4,"camera_source","fmt pixelformat: \'%c%c%c%c\', description = \'%s\'\n",0,
                       fmtdesc.pixelformat & 0xff,fmtdesc.pixelformat >> 8 & 0xff,
                       fmtdesc.pixelformat >> 0x10 & 0xff,fmtdesc.pixelformat >> 0x18,
                       fmtdesc.description);
            fmtdesc.index = fmtdesc.index + 1;
          }
          uVar6 = (uint)local_288;
          if ((uVar6 & 0xfffc) < 0x14 && (local_288 & 0xf0000) == 0) {
            local_198 = V4L2_yuv_cfg[local_288 & 0xffffffff];
          }
          else if ((uVar6 & 0xf0000) == 0x10000 && (uVar6 & 0x1fff0) < 0x10010) {
            local_198 = V4L2_RGB_cfg[uVar6 - 0x10000];
          }
          if (local_198 == 0) {
            local_198 = 0x3231564e;
          }
          type = local_1a8;
          ctx->type = local_1a8;
          RVar2 = camera_source_ioctl(ctx->fd,-0x3f2fa9fb,&local_1a8);
          if (RVar2 == -1) {
            pcVar4 = "VIDIOC_S_FMT\n";
          }
          else {
            RVar2 = camera_source_ioctl(ctx->fd,-0x3f2fa9fc,&local_1a8);
            if (RVar2 == -1) {
              pcVar4 = "VIDIOC_G_FMT\n";
            }
            else {
              _mpp_log_l(4,"camera_source","get width %d height %d",0,local_1a0,local_19c);
              local_1b0 = 0;
              local_1bc = ctx->bufcnt;
              local_1b8 = vVar1;
              local_1b4 = 1;
              RVar2 = camera_source_ioctl(ctx->fd,-0x3feba9f8,&local_1bc);
              if (RVar2 == -1) {
                pcVar4 = "Device does not support mmap\n";
              }
              else if (local_1bc == ctx->bufcnt) {
                ppvVar8 = &ctx->fbuf[0].buffer;
                uVar6 = local_1bc;
                for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
                  pvStack_240 = (v4l2_plane *)0x0;
                  fmtdesc.description[0x1c] = '\0';
                  fmtdesc.description[0x1d] = '\0';
                  fmtdesc.description[0x1e] = '\0';
                  fmtdesc.description[0x1f] = '\0';
                  fmtdesc.pixelformat = 0;
                  fmtdesc.mbus_code = 0;
                  fmtdesc.reserved[0] = 0;
                  fmtdesc.description[0xc] = '\0';
                  fmtdesc.description[0xd] = '\0';
                  fmtdesc.description[0xe] = '\0';
                  fmtdesc.description[0xf] = '\0';
                  fmtdesc.description[0x10] = '\0';
                  fmtdesc.description[0x11] = '\0';
                  fmtdesc.description[0x12] = '\0';
                  fmtdesc.description[0x13] = '\0';
                  fmtdesc.description[0x14] = '\0';
                  fmtdesc.description[0x15] = '\0';
                  fmtdesc.description[0x16] = '\0';
                  fmtdesc.description[0x17] = '\0';
                  fmtdesc.description[0x18] = '\0';
                  fmtdesc.description[0x19] = '\0';
                  fmtdesc.description[0x1a] = '\0';
                  fmtdesc.description[0x1b] = '\0';
                  fmtdesc.flags = 0;
                  fmtdesc.description[0] = '\0';
                  fmtdesc.description[1] = '\0';
                  fmtdesc.description[2] = '\0';
                  fmtdesc.description[3] = '\0';
                  fmtdesc.description[4] = '\0';
                  fmtdesc.description[5] = '\0';
                  fmtdesc.description[6] = '\0';
                  fmtdesc.description[7] = '\0';
                  fmtdesc.description[8] = '\0';
                  fmtdesc.description[9] = '\0';
                  fmtdesc.description[10] = '\0';
                  fmtdesc.description[0xb] = '\0';
                  fmtdesc.type = vVar1;
                  fmtdesc.reserved[1] = 0;
                  fmtdesc.reserved[2] = 1;
                  if (vVar1 == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE) {
                    pvStack_240 = planes;
                  }
                  fmtdesc.index = (__u32)uVar7;
                  RVar2 = camera_source_ioctl(ctx->fd,-0x3fa7a9f7,&fmtdesc);
                  if (RVar2 == -1) {
                    pcVar4 = "ERROR: VIDIOC_QUERYBUF\n";
                    goto LAB_0010fe5b;
                  }
                  if (fmtdesc.type == 9) {
                    local_238 = pvStack_240->length;
                    pvStack_240._0_4_ = (pvStack_240->m).mem_offset;
                  }
                  else {
                    local_238 = (uint)(vVar1 == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE);
                  }
                  pvVar3 = mmap((void *)0x0,(ulong)local_238,3,1,ctx->fd,(ulong)(uint)pvStack_240);
                  ((CamFrame *)(ppvVar8 + -3))->start = pvVar3;
                  if (pvVar3 == (void *)0xffffffffffffffff) {
                    pcVar4 = "ERROR: Failed to map device frame buffers\n";
                    goto LAB_0010fe5b;
                  }
                  ppvVar8[-2] = (MppBuffer)(ulong)local_238;
                  local_1d4 = 0;
                  uStack_1cc = 0;
                  local_1e4 = 0;
                  uStack_1dc = 0;
                  uStack_1ec = 0;
                  local_1c4 = 0;
                  local_1fc = vVar1;
                  local_1f4 = 0x8000000000000;
                  local_1f8 = (__u32)uVar7;
                  RVar2 = camera_source_ioctl(ctx->fd,-0x3fbfa9f0,&local_1fc);
                  if (RVar2 < 0) {
                    pcVar4 = "get dma buf failed\n";
                    goto LAB_0010fe5b;
                  }
                  _mpp_log_l(4,"camera_source","get dma buf(%d)-fd: %d\n",0,uVar7 & 0xffffffff,
                             uStack_1ec & 0xffffffff);
                  local_218 = 0;
                  uStack_210 = 0;
                  local_228 = 2;
                  local_208 = (RK_S32)uStack_1ec;
                  uStack_220 = (ulong)(local_238 & 0x7ffffff);
                  local_204 = local_238 >> 0x1b;
                  mpp_buffer_import_with_tag
                            (0,&local_228,ppvVar8,"camera_source","camera_source_init");
                  *(RK_S32 *)(ppvVar8 + -1) = (RK_S32)uStack_1ec;
                  uVar6 = ctx->bufcnt;
                  ppvVar8 = ppvVar8 + 4;
                }
                for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
                  fmtdesc.description[0x1c] = '\0';
                  fmtdesc.description[0x1d] = '\0';
                  fmtdesc.description[0x1e] = '\0';
                  fmtdesc.description[0x1f] = '\0';
                  fmtdesc.pixelformat = 0;
                  fmtdesc.mbus_code = 0;
                  fmtdesc.reserved[0] = 0;
                  fmtdesc.description[0xc] = '\0';
                  fmtdesc.description[0xd] = '\0';
                  fmtdesc.description[0xe] = '\0';
                  fmtdesc.description[0xf] = '\0';
                  fmtdesc.description[0x10] = '\0';
                  fmtdesc.description[0x11] = '\0';
                  fmtdesc.description[0x12] = '\0';
                  fmtdesc.description[0x13] = '\0';
                  fmtdesc.description[0x14] = '\0';
                  fmtdesc.description[0x15] = '\0';
                  fmtdesc.description[0x16] = '\0';
                  fmtdesc.description[0x17] = '\0';
                  fmtdesc.description[0x18] = '\0';
                  fmtdesc.description[0x19] = '\0';
                  fmtdesc.description[0x1a] = '\0';
                  fmtdesc.description[0x1b] = '\0';
                  fmtdesc.flags = 0;
                  fmtdesc.description[0] = '\0';
                  fmtdesc.description[1] = '\0';
                  fmtdesc.description[2] = '\0';
                  fmtdesc.description[3] = '\0';
                  fmtdesc.description[4] = '\0';
                  fmtdesc.description[5] = '\0';
                  fmtdesc.description[6] = '\0';
                  fmtdesc.description[7] = '\0';
                  fmtdesc.description[8] = '\0';
                  fmtdesc.description[9] = '\0';
                  fmtdesc.description[10] = '\0';
                  fmtdesc.description[0xb] = '\0';
                  fmtdesc.type = vVar1;
                  fmtdesc.reserved[1] = 0;
                  fmtdesc.reserved[2] = 1;
                  fmtdesc.index = uVar5;
                  RVar2 = camera_source_ioctl(ctx->fd,-0x3fa7a9f1,&fmtdesc);
                  if (RVar2 == -1) {
                    _mpp_log_l(2,"camera_source","ERROR: VIDIOC_QBUF %d\n","camera_source_init",
                               uVar5);
                    goto LAB_0010fe6c;
                  }
                  uVar6 = ctx->bufcnt;
                }
                RVar2 = camera_source_ioctl(ctx->fd,0x40045612,&type);
                if (RVar2 != -1) {
                  for (uVar6 = 0; uVar6 < ctx->bufcnt; uVar6 = uVar6 + 1) {
                    RVar2 = camera_source_get_frame(ctx);
                    if (-1 < RVar2) {
                      camera_source_put_frame(ctx,RVar2);
                    }
                  }
                  return ctx;
                }
                pcVar4 = "ERROR: VIDIOC_STREAMON\n";
              }
              else {
                pcVar4 = "Device buffer count mismatch\n";
              }
            }
          }
        }
      }
      else {
        pcVar4 = "Not v4l2 compatible\n";
      }
    }
LAB_0010fe5b:
    _mpp_log_l(2,"camera_source",pcVar4,"camera_source_init");
LAB_0010fe6c:
    camera_source_deinit(ctx);
  }
  return (CamSource *)0x0;
}

Assistant:

CamSource *camera_source_init(const char *device, RK_U32 bufcnt, RK_U32 width, RK_U32 height, MppFrameFormat format)
{
    struct v4l2_capability     cap;
    struct v4l2_format         vfmt;
    struct v4l2_requestbuffers req;
    struct v4l2_buffer         buf;
    enum   v4l2_buf_type       type;
    RK_U32 i;
    RK_U32 buf_len = 0;
    CamSource *ctx;

    ctx = mpp_calloc(CamSource, 1);
    if (!ctx)
        return NULL;

    ctx->bufcnt = bufcnt;
    ctx->fd = open(device, O_RDWR | O_CLOEXEC, 0);
    if (ctx->fd < 0) {
        mpp_err_f("Cannot open device\n");
        goto FAIL;
    }

    {
        struct v4l2_input input;

        input.index = 0;
        while (!camera_source_ioctl(ctx->fd, VIDIOC_ENUMINPUT, &input)) {
            mpp_log("input devices:%s\n", input.name);
            ++input.index;
        }
    }

    // Determine if fd is a V4L2 Device
    if (0 != camera_source_ioctl(ctx->fd, VIDIOC_QUERYCAP, &cap)) {
        mpp_err_f("Not v4l2 compatible\n");
        goto FAIL;
    }

    if (!(cap.capabilities & V4L2_CAP_VIDEO_CAPTURE) && !(cap.capabilities & V4L2_CAP_VIDEO_CAPTURE_MPLANE)) {
        mpp_err_f("Capture not supported\n");
        goto FAIL;
    }

    if (!(cap.capabilities & V4L2_CAP_STREAMING)) {
        mpp_err_f("Streaming IO Not Supported\n");
        goto FAIL;
    }

    // Preserve original settings as set by v4l2-ctl for example
    vfmt = (struct v4l2_format) {0};
    vfmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;

    if (cap.capabilities & V4L2_CAP_VIDEO_CAPTURE_MPLANE)
        vfmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE;

    vfmt.fmt.pix.width = width;
    vfmt.fmt.pix.height = height;

    {
        struct v4l2_fmtdesc fmtdesc;

        fmtdesc.index = 0;
        fmtdesc.type = vfmt.type;
        while (!camera_source_ioctl(ctx->fd, VIDIOC_ENUM_FMT, &fmtdesc)) {
            mpp_log("fmt name: [%s]\n", fmtdesc.description);
            mpp_log("fmt pixelformat: '%c%c%c%c', description = '%s'\n", fmtdesc.pixelformat & 0xFF,
                    (fmtdesc.pixelformat >> 8) & 0xFF, (fmtdesc.pixelformat >> 16) & 0xFF,
                    (fmtdesc.pixelformat >> 24) & 0xFF, fmtdesc.description);
            fmtdesc.index++;
        }
    }

    if (MPP_FRAME_FMT_IS_YUV(format)) {
        vfmt.fmt.pix.pixelformat = V4L2_yuv_cfg[format - MPP_FRAME_FMT_YUV];
    } else if (MPP_FRAME_FMT_IS_RGB(format)) {
        vfmt.fmt.pix.pixelformat = V4L2_RGB_cfg[format - MPP_FRAME_FMT_RGB];
    }

    if (!vfmt.fmt.pix.pixelformat)
        vfmt.fmt.pix.pixelformat = V4L2_PIX_FMT_NV12;

    type = vfmt.type;
    ctx->type = vfmt.type;

    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_S_FMT, &vfmt)) {
        mpp_err_f("VIDIOC_S_FMT\n");
        goto FAIL;
    }

    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_G_FMT, &vfmt)) {
        mpp_err_f("VIDIOC_G_FMT\n");
        goto FAIL;
    }

    mpp_log("get width %d height %d", vfmt.fmt.pix.width, vfmt.fmt.pix.height);

    // Request memory-mapped buffers
    req = (struct v4l2_requestbuffers) {0};
    req.count  = ctx->bufcnt;
    req.type   = type;
    req.memory = V4L2_MEMORY_MMAP;
    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_REQBUFS, &req)) {
        mpp_err_f("Device does not support mmap\n");
        goto FAIL;
    }

    if (req.count != ctx->bufcnt) {
        mpp_err_f("Device buffer count mismatch\n");
        goto FAIL;
    }

    // mmap() the buffers into userspace memory
    for (i = 0 ; i < ctx->bufcnt; i++) {
        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        struct v4l2_plane planes[FMT_NUM_PLANES];
        buf.memory = V4L2_MEMORY_MMAP;
        if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
            buf.m.planes = planes;
            buf.length = FMT_NUM_PLANES;
        }

        if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_QUERYBUF, &buf)) {
            mpp_err_f("ERROR: VIDIOC_QUERYBUF\n");
            goto FAIL;
        }

        if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == buf.type) {
            // tmp_buffers[n_buffers].length = buf.m.planes[0].length;
            buf_len = buf.m.planes[0].length;
            ctx->fbuf[i].start =
                mmap(NULL /* start anywhere */,
                     buf.m.planes[0].length,
                     PROT_READ | PROT_WRITE /* required */,
                     MAP_SHARED /* recommended */,
                     ctx->fd, buf.m.planes[0].m.mem_offset);
        } else {
            buf_len = buf.length;
            ctx->fbuf[i].start =
                mmap(NULL /* start anywhere */,
                     buf.length,
                     PROT_READ | PROT_WRITE /* required */,
                     MAP_SHARED /* recommended */,
                     ctx->fd, buf.m.offset);
        }
        if (MAP_FAILED == ctx->fbuf[i].start) {
            mpp_err_f("ERROR: Failed to map device frame buffers\n");
            goto FAIL;
        }

        ctx->fbuf[i].length = buf_len; // record buffer length for unmap

        struct v4l2_exportbuffer expbuf = (struct v4l2_exportbuffer) {0} ;
        // xcam_mem_clear (expbuf);
        expbuf.type = type;
        expbuf.index = i;
        expbuf.flags = O_CLOEXEC;
        if (camera_source_ioctl(ctx->fd, VIDIOC_EXPBUF, &expbuf) < 0) {
            mpp_err_f("get dma buf failed\n");
            goto FAIL;
        } else {
            mpp_log("get dma buf(%d)-fd: %d\n", i, expbuf.fd);
            MppBufferInfo info;
            memset(&info, 0, sizeof(MppBufferInfo));
            info.type = MPP_BUFFER_TYPE_EXT_DMA;
            info.fd =  expbuf.fd;
            info.size = buf_len & 0x07ffffff;
            info.index = (buf_len & 0xf8000000) >> 27;
            mpp_buffer_import(&ctx->fbuf[i].buffer, &info);
        }
        ctx->fbuf[i].export_fd = expbuf.fd;
    }

    for (i = 0; i < ctx->bufcnt; i++ ) {
        struct v4l2_plane planes[FMT_NUM_PLANES];

        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        buf.memory = V4L2_MEMORY_MMAP;

        if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
            buf.m.planes = planes;
            buf.length = FMT_NUM_PLANES;
        }

        if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_QBUF, &buf)) {
            mpp_err_f("ERROR: VIDIOC_QBUF %d\n", i);
            goto FAIL;
        }
    }

    // Start capturing
    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_STREAMON, &type)) {
        mpp_err_f("ERROR: VIDIOC_STREAMON\n");
        goto FAIL;
    }

    //skip some frames at start
    for (i = 0; i < ctx->bufcnt; i++ ) {
        RK_S32 idx = camera_source_get_frame(ctx);
        if (idx >= 0)
            camera_source_put_frame(ctx, idx);
    }

    return ctx;

FAIL:
    camera_source_deinit(ctx);
    return NULL;
}